

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::UnknownsProject(ChSystemDescriptor *this,ChVectorDynamic<> *mx)

{
  double dVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  double *pdVar4;
  ChConstraint *pCVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  
  iVar6 = (*this->_vptr_ChSystemDescriptor[7])();
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this->n_q = iVar6;
  if ((long)ppCVar2 - (long)ppCVar3 != 0) {
    auVar13 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
    pdVar4 = (mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar10 = (long)ppCVar2 - (long)ppCVar3 >> 3;
    lVar8 = lVar10 + (ulong)(lVar10 == 0);
    lVar7 = 0;
    do {
      pCVar5 = ppCVar3[lVar7];
      if (pCVar5->active == true) {
        lVar9 = (long)pCVar5->offset + (long)iVar6;
        if (((int)lVar9 < 0) ||
           ((mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            lVar9)) goto LAB_0079485b;
        auVar11._0_8_ = -pdVar4[lVar9];
        auVar11._8_4_ = 0;
        auVar11._12_4_ = 0x80000000;
        dVar1 = (double)vmovlps_avx(auVar11);
        pCVar5->l_i = dVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar8 != lVar7);
    if (ppCVar2 != ppCVar3) {
      lVar7 = 0;
      do {
        pCVar5 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar7];
        if (pCVar5->active == true) {
          (*pCVar5->_vptr_ChConstraint[0xb])();
          auVar13 = ZEXT1664(CONCAT88(0x8000000000000000,0x8000000000000000));
        }
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
      if (ppCVar2 != ppCVar3) {
        ppCVar2 = (this->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar6 = this->n_q;
        pdVar4 = (mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        lVar7 = 0;
        do {
          pCVar5 = ppCVar2[lVar7];
          if (pCVar5->active == true) {
            lVar8 = (long)pCVar5->offset + (long)iVar6;
            if (((int)lVar8 < 0) ||
               ((mx->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows <= lVar8)) {
LAB_0079485b:
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            auVar12._0_8_ = -pCVar5->l_i;
            auVar12._8_4_ = auVar13._8_4_;
            auVar12._12_4_ = 0x80000000;
            dVar1 = (double)vmovlps_avx(auVar12);
            pdVar4[lVar8] = dVar1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar7);
      }
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::UnknownsProject(ChVectorDynamic<>& mx) {
    n_q = CountActiveVariables();

    auto vc_size = vconstraints.size();

    // vector -> constraints
    // Fetch from the second part of vector (x.l = -l), with flipped sign!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(-mx(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    // constraint projection!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive())
            vconstraints[ic]->Project();
    }

    // constraints -> vector
    // Fill the second part of vector, x.l, with constraint multipliers -l (with flipped sign!)
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            mx(vconstraints[ic]->GetOffset() + n_q) = -vconstraints[ic]->Get_l_i();
        }
    }
}